

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.hh
# Opt level: O2

void __thiscall SF_FlateLzwDecode::SF_FlateLzwDecode(SF_FlateLzwDecode *this,bool lzw)

{
  (this->super_QPDFStreamFilter)._vptr_QPDFStreamFilter =
       (_func_int **)&PTR__SF_FlateLzwDecode_002b0e70;
  this->lzw = lzw;
  this->predictor = 1;
  this->columns = 1;
  this->colors = 1;
  this->bits_per_component = 8;
  this->early_code_change = true;
  (this->pipelines).
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pipelines).
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pipelines).
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SF_FlateLzwDecode(bool lzw) :
        lzw(lzw)
    {
    }